

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O2

Builder * embree::sse2::BVH4VirtualMBSceneBuilderSAH(void *bvh,Scene *scene,size_t mode)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  Builder *pBVar4;
  __int_type_conflict _Var5;
  
  lVar3 = *(long *)&(scene->super_AccelN).field_0x188;
  iVar1 = *(int *)(lVar3 + 0x398);
  uVar2 = *(uint *)(lVar3 + 0x39c);
  pBVar4 = (Builder *)::operator_new(0x48);
  (pBVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pBVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_021dde58;
  pBVar4[1].super_RefCount._vptr_RefCount = (_func_int **)bvh;
  pBVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)scene;
  pBVar4[2].super_RefCount._vptr_RefCount = (_func_int **)0x4;
  *(undefined4 *)&pBVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       0x3f800000;
  _Var5 = 7;
  if (uVar2 < 7) {
    _Var5 = (__int_type_conflict)uVar2;
  }
  pBVar4[3].super_RefCount._vptr_RefCount = (_func_int **)(long)iVar1;
  pBVar4[3].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = _Var5;
  pBVar4[4].super_RefCount._vptr_RefCount = (_func_int **)0x20000000;
  return pBVar4;
}

Assistant:

Builder* BVH4VirtualMBSceneBuilderSAH    (void* bvh, Scene* scene, size_t mode) {
      int minLeafSize = scene->device->object_accel_mb_min_leaf_size;
      int maxLeafSize = scene->device->object_accel_mb_max_leaf_size;
      return new BVHNBuilderMBlurSAH<4,UserGeometry,Object>((BVH4*)bvh,scene,4,1.0f,minLeafSize,maxLeafSize,Geometry::MTY_USER_GEOMETRY);
    }